

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_srcs.cxx
# Opt level: O3

void __thiscall
xray_re::xr_sound_src_object::xr_sound_src_object(xr_sound_src_object *this,xr_scene *scene)

{
  xr_custom_object::xr_custom_object(&this->super_xr_custom_object,scene,TOOLS_CLASS_SOUND_SRC);
  (this->super_xr_custom_object)._vptr_xr_custom_object =
       (_func_int **)&PTR__xr_sound_src_object_0024b038;
  *(undefined4 *)&(this->super_xr_custom_object).field_0x6c = 1;
  this->m_type = '\0';
  (this->m_source_name)._M_dataplus._M_p = (pointer)&(this->m_source_name).field_2;
  (this->m_source_name)._M_string_length = 0;
  (this->m_source_name).field_2._M_local_buf[0] = '\0';
  this->m_frequency = 1.0;
  this->m_min_dist = 1.0;
  this->m_max_dist = 30.0;
  this->m_max_ai_dist = 30.0;
  *(undefined8 *)&(this->m_sound_pos).field_0 = 0;
  *(undefined8 *)((long)&(this->m_sound_pos).field_0 + 8) = 0x3f80000000000000;
  (this->m_pause_time).field_0 = (anon_union_8_3_f28016de_for__vector2<float>_1)0x0;
  (this->m_active_time).field_0 = (anon_union_8_3_f28016de_for__vector2<float>_1)0x0;
  (this->m_play_time).field_0 = (anon_union_8_3_f28016de_for__vector2<float>_1)0x0;
  return;
}

Assistant:

xr_sound_src_object::xr_sound_src_object(xr_scene& scene):
	xr_custom_object(scene, TOOLS_CLASS_SOUND_SRC),
	m_flags(0x1), m_type(0),
	m_volume(1.f), m_frequency(1.f),
	m_min_dist(1.f), m_max_dist(30.f), m_max_ai_dist(30.f)
{
	m_sound_pos.set();
	m_pause_time.set();
	m_active_time.set();
	m_play_time.set();
}